

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmake::GetDebugConfigs_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmake *this)

{
  cmState *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_c9;
  value_type local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *config_list;
  cmake *local_18;
  cmake *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  
  config_list._7_1_ = 0;
  local_18 = this;
  this_local = (cmake *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"DEBUG_CONFIGURATIONS",&local_49);
  pcVar2 = cmState::GetGlobalProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar2,&local_81);
    cmSystemTools::ExpandListArgument(&local_80,__return_storage_ptr__,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_90._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(__return_storage_ptr__);
    local_98._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(__return_storage_ptr__);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(__return_storage_ptr__);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string(*)(std::__cxx11::string_const&)>
                         (local_90,local_98,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_a0,cmsys::SystemTools::UpperCase);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(__return_storage_ptr__);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"DEBUG",&local_c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmake::GetDebugConfigs()
{
  std::vector<std::string> configs;
  if(const char* config_list =
                      this->State->GetGlobalProperty("DEBUG_CONFIGURATIONS"))
    {
    // Expand the specified list and convert to upper-case.
    cmSystemTools::ExpandListArgument(config_list, configs);
    std::transform(configs.begin(),
                   configs.end(),
                   configs.begin(),
                   cmSystemTools::UpperCase);
    }
  // If no configurations were specified, use a default list.
  if(configs.empty())
    {
    configs.push_back("DEBUG");
    }
  return configs;
}